

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void google::protobuf::json_internal::ParseProto2Descriptor::SetFloat(Field f,Msg *msg,float x)

{
  bool bVar1;
  Reflection *pRVar2;
  float x_local;
  Msg *msg_local;
  Field f_local;
  
  RecordAsSeen(f,msg);
  bVar1 = FieldDescriptor::is_repeated(f);
  if (bVar1) {
    pRVar2 = Message::GetReflection(msg->msg_);
    Reflection::AddFloat(pRVar2,msg->msg_,f,x);
  }
  else {
    pRVar2 = Message::GetReflection(msg->msg_);
    Reflection::SetFloat(pRVar2,msg->msg_,f,x);
  }
  return;
}

Assistant:

static void SetFloat(Field f, Msg& msg, float x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddFloat(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetFloat(msg.msg_, f, x);
    }
  }